

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O3

void __thiscall QFileInfo::QFileInfo(QFileInfo *this,QString *path)

{
  QFileInfoPrivate *pQVar1;
  long lVar2;
  
  pQVar1 = (QFileInfoPrivate *)operator_new(0x1e8);
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  QFileSystemEntry::QFileSystemEntry(&pQVar1->fileEntry,path);
  (pQVar1->metaData).knownFlagsMask = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0
  ;
  (pQVar1->metaData).entryFlags = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (pQVar1->metaData).size_ = -1;
  (pQVar1->metaData).accessTime_ = 0;
  (pQVar1->metaData).birthTime_ = 0;
  (pQVar1->metaData).metadataChangeTime_ = 0;
  (pQVar1->metaData).modificationTime_ = 0;
  (pQVar1->metaData).userId_ = 0xfffffffe;
  (pQVar1->metaData).groupId_ = 0xfffffffe;
  QFileSystemEngine::createLegacyEngine
            ((QFileSystemEntry *)&pQVar1->fileEngine,(QFileSystemMetaData *)&pQVar1->fileEntry);
  memset(pQVar1->fileNames,0,0x138);
  lVar2 = 0x1b8;
  do {
    QDateTime::QDateTime((QDateTime *)((long)pQVar1->fileNames + lVar2 + -0x80));
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x1d8);
  *(uint *)&pQVar1->field_0x1d8 = ((path->d).size == 0 | 0xfffffffe) << 0x1e;
  pQVar1->fileFlags = 0;
  pQVar1->fileSize = 0;
  (this->d_ptr).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  return;
}

Assistant:

QFileInfo::QFileInfo(const QString &path) : d_ptr(new QFileInfoPrivate(path))
{
}